

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

ssize_t __thiscall
QHttpSocketEngine::read(QHttpSocketEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  SocketState SVar2;
  QHttpSocketEnginePrivate *pQVar3;
  long lVar4;
  undefined4 in_register_00000034;
  char *pcVar5;
  long in_FS_OFFSET;
  QLatin1StringView QVar6;
  qint64 bytesRead;
  QHttpSocketEnginePrivate *d;
  SocketState in_stack_ffffffffffffff8c;
  QString *in_stack_ffffffffffffff90;
  SocketError error;
  QString *this_00;
  long local_28;
  
  pcVar5 = (char *)CONCAT44(in_register_00000034,__fd);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QHttpSocketEngine *)0x339a84);
  local_28 = QIODevice::read((char *)pQVar3->socket,(longlong)pcVar5);
  SVar2 = QAbstractSocket::state((QAbstractSocket *)0x339aba);
  if ((SVar2 == UnconnectedState) &&
     (lVar4 = (**(code **)(*(long *)&pQVar3->socket->super_QAbstractSocket + 0xa0))(), lVar4 == 0))
  {
    emitReadNotification((QHttpSocketEngine *)in_stack_ffffffffffffff90);
  }
  if (local_28 == -1) {
    (**(code **)(*(long *)this + 0xa8))();
    QVar6 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)this,(size_t)in_stack_ffffffffffffff90);
    error = (SocketError)((ulong)this >> 0x20);
    this_00 = (QString *)QVar6.m_size;
    QVar6.m_data = pcVar5;
    QVar6.m_size = (qsizetype)__buf;
    QString::QString(this_00,QVar6);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)this_00,error,in_stack_ffffffffffffff90);
    QString::~QString((QString *)0x339b47);
    QAbstractSocketEngine::setState
              ((QAbstractSocketEngine *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    local_28 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

qint64 QHttpSocketEngine::read(char *data, qint64 maxlen)
{
    Q_D(QHttpSocketEngine);
    qint64 bytesRead = d->socket->read(data, maxlen);

    if (d->socket->state() == QAbstractSocket::UnconnectedState
        && d->socket->bytesAvailable() == 0) {
        emitReadNotification();
    }

    if (bytesRead == -1) {
        // If nothing has been read so far, and the direct socket read
        // failed, return the socket's error. Otherwise, fall through and
        // return as much as we read so far.
        close();
        setError(QAbstractSocket::RemoteHostClosedError, "Remote host closed"_L1);
        setState(QAbstractSocket::UnconnectedState);
        return -1;
    }
    return bytesRead;
}